

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

bool __thiscall QToolBarLayout::movable(QToolBarLayout *this)

{
  QToolBar *pQVar1;
  QMainWindow *this_00;
  QLayout *in_RDI;
  QMainWindow *win;
  QToolBar *tb;
  bool local_21;
  bool local_1;
  
  QLayout::parentWidget(in_RDI);
  pQVar1 = qobject_cast<QToolBar*>((QObject *)0x6fdcff);
  if (pQVar1 == (QToolBar *)0x0) {
    local_1 = false;
  }
  else {
    QWidget::parentWidget((QWidget *)0x6fdd1d);
    this_00 = qobject_cast<QMainWindow*>((QObject *)0x6fdd25);
    local_21 = QToolBar::isMovable((QToolBar *)this_00);
    local_21 = local_21 && this_00 != (QMainWindow *)0x0;
    local_1 = local_21;
  }
  return local_1;
}

Assistant:

bool QToolBarLayout::movable() const
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    return tb->isMovable() && win != nullptr;
}